

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O0

int __thiscall
QtMWidgets::NavigationArrowPrivate::init(NavigationArrowPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  QPalette *this_00;
  QColor *pQVar3;
  QTimer *this_01;
  Object local_28 [24];
  NavigationArrowPrivate *local_10;
  NavigationArrowPrivate *this_local;
  
  local_10 = this;
  this_00 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(this_00,Highlight);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->baseColor).ct + 2) = *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->baseColor = uVar1;
  uVar1 = *(undefined8 *)&this->baseColor;
  *(undefined8 *)((long)&(this->color).ct + 2) = *(undefined8 *)((long)&(this->baseColor).ct + 2);
  *(undefined8 *)&this->color = uVar1;
  this_01 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(this_01,(QObject *)this->q);
  this->timer = this_01;
  QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::NavigationArrow::*)()>
            (local_28,(offset_in_QTimer_to_subr)this->timer,(Object *)QTimer::timeout,0,
             (ConnectionType)this->q);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QWidget::setSizePolicy(&this->q->super_QWidget,Fixed,Fixed);
  QWidget::setBackgroundRole((ColorRole)this->q);
  iVar2 = QWidget::setAutoFillBackground(SUB81(this->q,0));
  return iVar2;
}

Assistant:

void init()
	{
		baseColor = q->palette().color( QPalette::Highlight );
		color = baseColor;
		timer = new QTimer( q );

		QObject::connect( timer, &QTimer::timeout,
			q, &NavigationArrow::_q_timer );

		q->setSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed );

		q->setBackgroundRole( QPalette::Base );
		q->setAutoFillBackground( true );
	}